

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
eglu::attribMapToList(vector<int,_std::allocator<int>_> *__return_storage_ptr__,AttribMap *attribs)

{
  int *piVar1;
  _Base_ptr p_Var2;
  iterator iVar3;
  _Rb_tree_header *p_Var4;
  int local_1c;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = (attribs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(attribs->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var4) {
    iVar3._M_current = (int *)0x0;
  }
  else {
    do {
      iVar3._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (iVar3._M_current == piVar1) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar3,
                   (int *)(p_Var2 + 1));
        iVar3._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar3._M_current = p_Var2[1]._M_color;
        iVar3._M_current = iVar3._M_current + 1;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current;
      }
      if (iVar3._M_current == piVar1) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar3,
                   (int *)&p_Var2[1].field_0x4);
      }
      else {
        *iVar3._M_current = *(int *)&p_Var2[1].field_0x4;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
    iVar3._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current !=
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *iVar3._M_current = 0x3038;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      return __return_storage_ptr__;
    }
  }
  local_1c = 0x3038;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (__return_storage_ptr__,iVar3,&local_1c);
  return __return_storage_ptr__;
}

Assistant:

vector<EGLint> attribMapToList (const AttribMap& attribs)
{
	vector<EGLint> attribList;

	for (AttribMap::const_iterator it = attribs.begin(); it != attribs.end(); ++it)
	{
		attribList.push_back(it->first);
		attribList.push_back(it->second);
	}

	attribList.push_back(EGL_NONE);

	return attribList;
}